

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_sse4.c
# Opt level: O1

void load_buffer_16x16(int16_t *input,__m128i *out,int stride,int flipud,int fliplr,int shift)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  undefined1 (*pauVar3) [16];
  undefined1 (*pauVar4) [16];
  undefined1 (*pauVar5) [16];
  undefined1 (*pauVar6) [16];
  long lVar7;
  undefined1 (*pauVar8) [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 in_XMM4 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 in_XMM6 [16];
  undefined1 auVar23 [16];
  undefined1 in_XMM7 [16];
  undefined1 auVar24 [16];
  undefined1 in_XMM8 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 in_XMM10 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 in_XMM12 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 in_XMM13 [16];
  undefined1 auVar36 [16];
  undefined1 in_XMM14 [16];
  undefined1 auVar37 [16];
  undefined1 in_XMM15 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  int local_438;
  undefined4 uStack_434;
  undefined4 uStack_430;
  undefined4 uStack_42c;
  undefined1 local_428 [16];
  undefined1 local_418 [16];
  undefined1 local_408 [16];
  undefined1 local_3f8 [16];
  undefined1 local_3e8 [16];
  undefined1 local_3d8 [16];
  undefined1 local_3c8 [16];
  undefined1 local_3b8 [16];
  undefined1 local_3a8 [16];
  undefined1 local_398 [16];
  undefined1 local_388 [16];
  int local_378;
  undefined4 uStack_374;
  undefined4 uStack_370;
  undefined4 uStack_36c;
  undefined1 local_368 [16];
  int local_358;
  undefined4 uStack_354;
  undefined4 uStack_350;
  undefined4 uStack_34c;
  undefined1 local_348 [16];
  int local_338;
  undefined4 uStack_334;
  undefined4 uStack_330;
  undefined4 uStack_32c;
  undefined1 local_328 [16];
  undefined1 local_318 [16];
  undefined1 local_308 [16];
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  int local_278;
  undefined4 uStack_274;
  undefined4 uStack_270;
  undefined4 uStack_26c;
  undefined1 local_268 [16];
  int local_258;
  undefined4 uStack_254;
  undefined4 uStack_250;
  undefined4 uStack_24c;
  undefined1 local_248 [16];
  int local_238;
  undefined4 uStack_234;
  undefined4 uStack_230;
  undefined4 uStack_22c;
  undefined1 local_228 [16];
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  int local_178;
  undefined4 uStack_174;
  undefined4 uStack_170;
  undefined4 uStack_16c;
  undefined1 local_168 [16];
  int local_158;
  undefined4 uStack_154;
  undefined4 uStack_150;
  undefined4 uStack_14c;
  undefined1 local_148 [16];
  int local_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  int local_a8;
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  int local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  int local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  int local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  int local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  int local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  int local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  int local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  
  pauVar6 = (undefined1 (*) [16])(input + (long)(stride * 8) + 8);
  pauVar3 = (undefined1 (*) [16])(input + 8);
  pauVar5 = (undefined1 (*) [16])(input + stride * 8);
  if (flipud != 0) {
    pauVar3 = pauVar6;
    pauVar5 = (undefined1 (*) [16])input;
    pauVar6 = (undefined1 (*) [16])(input + 8);
    input = input + stride * 8;
  }
  pauVar4 = pauVar5;
  pauVar8 = pauVar3;
  if (fliplr != 0) {
    pauVar4 = pauVar6;
    pauVar6 = pauVar5;
    pauVar8 = (undefined1 (*) [16])input;
    input = (int16_t *)pauVar3;
  }
  lVar7 = (long)stride;
  if (flipud == 0) {
    local_428 = *(undefined1 (*) [16])input;
    local_418 = *(undefined1 (*) [16])(*(undefined1 (*) [16])input + lVar7 * 2);
    local_408 = *(undefined1 (*) [16])(*(undefined1 (*) [16])input + (long)(stride * 2) * 2);
    local_3f8 = *(undefined1 (*) [16])(*(undefined1 (*) [16])input + (long)(stride * 3) * 2);
    local_3e8 = *(undefined1 (*) [16])(*(undefined1 (*) [16])input + (long)(stride * 4) * 2);
    local_3d8 = *(undefined1 (*) [16])(*(undefined1 (*) [16])input + (long)(stride * 5) * 2);
    local_3c8 = *(undefined1 (*) [16])(*(undefined1 (*) [16])input + (long)(stride * 6) * 2);
    input = (int16_t *)(*(undefined1 (*) [16])input + (long)(stride * 7) * 2);
  }
  else {
    local_428 = *(undefined1 (*) [16])(*(undefined1 (*) [16])input + (long)(stride * 7) * 2);
    local_418 = *(undefined1 (*) [16])(*(undefined1 (*) [16])input + (long)(stride * 6) * 2);
    local_408 = *(undefined1 (*) [16])(*(undefined1 (*) [16])input + (long)(stride * 5) * 2);
    local_3f8 = *(undefined1 (*) [16])(*(undefined1 (*) [16])input + (long)(stride * 4) * 2);
    local_3e8 = *(undefined1 (*) [16])(*(undefined1 (*) [16])input + (long)(stride * 3) * 2);
    local_3d8 = *(undefined1 (*) [16])(*(undefined1 (*) [16])input + (long)(stride * 2) * 2);
    local_3c8 = *(undefined1 (*) [16])(*(undefined1 (*) [16])input + lVar7 * 2);
  }
  local_3b8 = *(undefined1 (*) [16])input;
  if (fliplr != 0) {
    local_428 = pshufb(local_428,_DAT_005634a0);
    in_XMM2 = pshufb(local_418,_DAT_005634a0);
    local_408 = pshufb(local_408,_DAT_005634a0);
    in_XMM4 = pshufb(local_3f8,_DAT_005634a0);
    local_3e8 = pshufb(local_3e8,_DAT_005634a0);
    local_3d8 = pshufb(local_3d8,_DAT_005634a0);
    local_3c8 = pshufb(local_3c8,_DAT_005634a0);
    local_3b8 = pshufb(local_3b8,_DAT_005634a0);
    local_418 = in_XMM2;
    local_3f8 = in_XMM4;
  }
  auVar23 = pmovsxwd(in_XMM6,local_3e8);
  auVar14._8_4_ = local_3e8._8_4_;
  auVar14._12_4_ = local_3e8._12_4_;
  auVar14._0_8_ = local_3e8._8_8_;
  auVar24 = pmovsxwd(in_XMM7,auVar14);
  auVar25 = pmovsxwd(in_XMM8,local_3d8);
  auVar15._8_4_ = local_3d8._8_4_;
  auVar15._12_4_ = local_3d8._12_4_;
  auVar15._0_8_ = local_3d8._8_8_;
  auVar14 = pmovsxwd(auVar15,auVar15);
  auVar15 = pmovsxwd(in_XMM2,local_3c8);
  auVar16._8_4_ = local_3c8._8_4_;
  auVar16._12_4_ = local_3c8._12_4_;
  auVar16._0_8_ = local_3c8._8_8_;
  auVar16 = pmovsxwd(auVar16,auVar16);
  auVar19 = pmovsxwd(in_XMM4,local_3b8);
  auVar20._8_4_ = local_3b8._8_4_;
  auVar20._12_4_ = local_3b8._12_4_;
  auVar20._0_8_ = local_3b8._8_8_;
  auVar20 = pmovsxwd(auVar20,auVar20);
  auVar29 = pmovsxwd(in_XMM10,local_3f8);
  auVar26._8_4_ = local_3f8._8_4_;
  auVar26._12_4_ = local_3f8._12_4_;
  auVar26._0_8_ = local_3f8._8_8_;
  auVar26 = pmovsxwd(auVar26,auVar26);
  auVar33 = pmovsxwd(in_XMM12,local_408);
  auVar30._8_4_ = local_408._8_4_;
  auVar30._12_4_ = local_408._12_4_;
  auVar30._0_8_ = local_408._8_8_;
  auVar30 = pmovsxwd(auVar30,auVar30);
  auVar36 = pmovsxwd(in_XMM13,local_418);
  auVar9._8_4_ = local_418._8_4_;
  auVar9._12_4_ = local_418._12_4_;
  auVar9._0_8_ = local_418._8_8_;
  auVar37 = pmovsxwd(in_XMM14,auVar9);
  auVar38 = pmovsxwd(in_XMM15,local_428);
  auVar10._8_4_ = local_428._8_4_;
  auVar10._12_4_ = local_428._12_4_;
  auVar10._0_8_ = local_428._8_8_;
  auVar9 = pmovsxwd(auVar10,auVar10);
  local_428._4_4_ = auVar38._4_4_;
  local_428._0_4_ = auVar38._0_4_ << shift;
  local_428._8_4_ = auVar38._8_4_;
  local_428._12_4_ = auVar38._12_4_;
  local_418._4_4_ = auVar9._4_4_;
  local_418._0_4_ = auVar9._0_4_ << shift;
  local_418._8_4_ = auVar9._8_4_;
  local_418._12_4_ = auVar9._12_4_;
  local_408._0_4_ = auVar36._0_4_ << shift;
  local_408._4_4_ = auVar36._4_4_;
  local_408._8_4_ = auVar36._8_4_;
  local_408._12_4_ = auVar36._12_4_;
  local_3f8._0_4_ = auVar37._0_4_ << shift;
  local_3f8._4_4_ = auVar37._4_4_;
  local_3f8._8_4_ = auVar37._8_4_;
  local_3f8._12_4_ = auVar37._12_4_;
  local_3e8._4_4_ = auVar33._4_4_;
  local_3e8._0_4_ = auVar33._0_4_ << shift;
  local_3e8._8_4_ = auVar33._8_4_;
  local_3e8._12_4_ = auVar33._12_4_;
  local_3d8._4_4_ = auVar30._4_4_;
  local_3d8._0_4_ = auVar30._0_4_ << shift;
  local_3d8._8_4_ = auVar30._8_4_;
  local_3d8._12_4_ = auVar30._12_4_;
  local_3c8._0_4_ = auVar29._0_4_ << shift;
  local_3c8._4_4_ = auVar29._4_4_;
  local_3c8._8_4_ = auVar29._8_4_;
  local_3c8._12_4_ = auVar29._12_4_;
  local_3a8._0_4_ = auVar23._0_4_ << shift;
  local_3a8._4_4_ = auVar23._4_4_;
  local_3a8._8_4_ = auVar23._8_4_;
  local_3a8._12_4_ = auVar23._12_4_;
  local_3b8._4_4_ = auVar26._4_4_;
  local_3b8._0_4_ = auVar26._0_4_ << shift;
  local_3b8._8_4_ = auVar26._8_4_;
  local_3b8._12_4_ = auVar26._12_4_;
  local_398._0_4_ = auVar24._0_4_ << shift;
  local_398._4_4_ = auVar24._4_4_;
  local_398._8_4_ = auVar24._8_4_;
  local_398._12_4_ = auVar24._12_4_;
  local_388._0_4_ = auVar25._0_4_ << shift;
  local_388._4_4_ = auVar25._4_4_;
  local_388._8_4_ = auVar25._8_4_;
  local_388._12_4_ = auVar25._12_4_;
  local_438 = auVar14._0_4_;
  uStack_434 = auVar14._4_4_;
  uStack_430 = auVar14._8_4_;
  uStack_42c = auVar14._12_4_;
  local_368._0_4_ = auVar15._0_4_ << shift;
  local_368._4_4_ = auVar15._4_4_;
  local_368._8_4_ = auVar15._8_4_;
  local_368._12_4_ = auVar15._12_4_;
  uStack_374 = uStack_434;
  local_378 = local_438 << shift;
  uStack_370 = uStack_430;
  uStack_36c = uStack_42c;
  uStack_354 = auVar16._4_4_;
  local_358 = auVar16._0_4_ << shift;
  uStack_350 = auVar16._8_4_;
  uStack_34c = auVar16._12_4_;
  local_348._0_4_ = auVar19._0_4_ << shift;
  local_348._4_4_ = auVar19._4_4_;
  local_348._8_4_ = auVar19._8_4_;
  local_348._12_4_ = auVar19._12_4_;
  uStack_334 = auVar20._4_4_;
  local_338 = auVar20._0_4_ << shift;
  uStack_330 = auVar20._8_4_;
  uStack_32c = auVar20._12_4_;
  if (flipud == 0) {
    local_228 = *pauVar4;
    local_218 = *(undefined1 (*) [16])(*pauVar4 + lVar7 * 2);
    local_208 = *(undefined1 (*) [16])(*pauVar4 + (long)(stride * 2) * 2);
    local_1f8 = *(undefined1 (*) [16])(*pauVar4 + (long)(stride * 3) * 2);
    local_1e8 = *(undefined1 (*) [16])(*pauVar4 + (long)(stride * 4) * 2);
    local_1d8 = *(undefined1 (*) [16])(*pauVar4 + (long)(stride * 5) * 2);
    local_1c8 = *(undefined1 (*) [16])(*pauVar4 + (long)(stride * 6) * 2);
    pauVar4 = (undefined1 (*) [16])(*pauVar4 + (long)(stride * 7) * 2);
  }
  else {
    local_228 = *(undefined1 (*) [16])(*pauVar4 + (long)(stride * 7) * 2);
    local_218 = *(undefined1 (*) [16])(*pauVar4 + (long)(stride * 6) * 2);
    local_208 = *(undefined1 (*) [16])(*pauVar4 + (long)(stride * 5) * 2);
    local_1f8 = *(undefined1 (*) [16])(*pauVar4 + (long)(stride * 4) * 2);
    local_1e8 = *(undefined1 (*) [16])(*pauVar4 + (long)(stride * 3) * 2);
    local_1d8 = *(undefined1 (*) [16])(*pauVar4 + (long)(stride * 2) * 2);
    local_1c8 = *(undefined1 (*) [16])(*pauVar4 + lVar7 * 2);
  }
  local_1b8 = *pauVar4;
  if (fliplr != 0) {
    local_228 = pshufb(local_228,_DAT_005634a0);
    local_218 = pshufb(local_218,_DAT_005634a0);
    local_348 = pshufb(local_208,_DAT_005634a0);
    local_1f8 = pshufb(local_1f8,_DAT_005634a0);
    local_1e8 = pshufb(local_1e8,_DAT_005634a0);
    local_1d8 = pshufb(local_1d8,_DAT_005634a0);
    local_1c8 = pshufb(local_1c8,_DAT_005634a0);
    local_368 = pshufb(*pauVar4,_DAT_005634a0);
    local_208 = local_348;
    local_1b8 = local_368;
  }
  auVar20 = pmovsxwd(local_3a8,local_1e8);
  auVar19._8_4_ = local_1e8._8_4_;
  auVar19._12_4_ = local_1e8._12_4_;
  auVar19._0_8_ = local_1e8._8_8_;
  auVar26 = pmovsxwd(local_398,auVar19);
  auVar29 = pmovsxwd(local_388,local_1d8);
  auVar23._8_4_ = local_1d8._8_4_;
  auVar23._12_4_ = local_1d8._12_4_;
  auVar23._0_8_ = local_1d8._8_8_;
  auVar9 = pmovsxwd(auVar23,auVar23);
  auVar14 = pmovsxwd(local_368,local_1c8);
  auVar24._8_4_ = local_1c8._8_4_;
  auVar24._12_4_ = local_1c8._12_4_;
  auVar24._0_8_ = local_1c8._8_8_;
  auVar15 = pmovsxwd(auVar24,auVar24);
  auVar16 = pmovsxwd(local_348,local_1b8);
  auVar25._8_4_ = local_1b8._8_4_;
  auVar25._12_4_ = local_1b8._12_4_;
  auVar25._0_8_ = local_1b8._8_8_;
  auVar19 = pmovsxwd(auVar25,auVar25);
  auVar24 = pmovsxwd(local_3c8,local_1f8);
  auVar33._8_4_ = local_1f8._8_4_;
  auVar33._12_4_ = local_1f8._12_4_;
  auVar33._0_8_ = local_1f8._8_8_;
  auVar23 = pmovsxwd(auVar33,auVar33);
  auVar33 = pmovsxwd(local_408,local_208);
  auVar37._8_4_ = local_208._8_4_;
  auVar37._12_4_ = local_208._12_4_;
  auVar37._0_8_ = local_208._8_8_;
  auVar30 = pmovsxwd(auVar37,auVar37);
  auVar37 = pmovsxwd(local_3f8,local_218);
  auVar36._8_4_ = local_218._8_4_;
  auVar36._12_4_ = local_218._12_4_;
  auVar36._0_8_ = local_218._8_8_;
  auVar25 = pmovsxwd(auVar36,auVar36);
  auVar10 = pmovsxwd(auVar9,local_228);
  auVar38._8_4_ = local_228._8_4_;
  auVar38._12_4_ = local_228._12_4_;
  auVar38._0_8_ = local_228._8_8_;
  auVar36 = pmovsxwd(auVar38,auVar38);
  local_228._4_4_ = auVar10._4_4_;
  local_228._0_4_ = auVar10._0_4_ << shift;
  local_228._8_4_ = auVar10._8_4_;
  local_228._12_4_ = auVar10._12_4_;
  local_218._4_4_ = auVar36._4_4_;
  local_218._0_4_ = auVar36._0_4_ << shift;
  local_218._8_4_ = auVar36._8_4_;
  local_218._12_4_ = auVar36._12_4_;
  local_208._0_4_ = auVar37._0_4_ << shift;
  local_208._4_4_ = auVar37._4_4_;
  local_208._8_4_ = auVar37._8_4_;
  local_208._12_4_ = auVar37._12_4_;
  local_1e8._0_4_ = auVar33._0_4_ << shift;
  local_1e8._4_4_ = auVar33._4_4_;
  local_1e8._8_4_ = auVar33._8_4_;
  local_1e8._12_4_ = auVar33._12_4_;
  local_1f8._4_4_ = auVar25._4_4_;
  local_1f8._0_4_ = auVar25._0_4_ << shift;
  local_1f8._8_4_ = auVar25._8_4_;
  local_1f8._12_4_ = auVar25._12_4_;
  local_1d8._4_4_ = auVar30._4_4_;
  local_1d8._0_4_ = auVar30._0_4_ << shift;
  local_1d8._8_4_ = auVar30._8_4_;
  local_1d8._12_4_ = auVar30._12_4_;
  local_1c8._0_4_ = auVar24._0_4_ << shift;
  local_1c8._4_4_ = auVar24._4_4_;
  local_1c8._8_4_ = auVar24._8_4_;
  local_1c8._12_4_ = auVar24._12_4_;
  local_1a8._0_4_ = auVar20._0_4_ << shift;
  local_1a8._4_4_ = auVar20._4_4_;
  local_1a8._8_4_ = auVar20._8_4_;
  local_1a8._12_4_ = auVar20._12_4_;
  local_1b8._4_4_ = auVar23._4_4_;
  local_1b8._0_4_ = auVar23._0_4_ << shift;
  local_1b8._8_4_ = auVar23._8_4_;
  local_1b8._12_4_ = auVar23._12_4_;
  local_198._0_4_ = auVar26._0_4_ << shift;
  local_198._4_4_ = auVar26._4_4_;
  local_198._8_4_ = auVar26._8_4_;
  local_198._12_4_ = auVar26._12_4_;
  local_188._0_4_ = auVar29._0_4_ << shift;
  local_188._4_4_ = auVar29._4_4_;
  local_188._8_4_ = auVar29._8_4_;
  local_188._12_4_ = auVar29._12_4_;
  local_438 = auVar9._0_4_;
  uStack_434 = auVar9._4_4_;
  uStack_430 = auVar9._8_4_;
  uStack_42c = auVar9._12_4_;
  local_168._0_4_ = auVar14._0_4_ << shift;
  local_168._4_4_ = auVar14._4_4_;
  local_168._8_4_ = auVar14._8_4_;
  local_168._12_4_ = auVar14._12_4_;
  uStack_174 = uStack_434;
  local_178 = local_438 << shift;
  uStack_170 = uStack_430;
  uStack_16c = uStack_42c;
  uStack_154 = auVar15._4_4_;
  local_158 = auVar15._0_4_ << shift;
  uStack_150 = auVar15._8_4_;
  uStack_14c = auVar15._12_4_;
  local_148._0_4_ = auVar16._0_4_ << shift;
  local_148._4_4_ = auVar16._4_4_;
  local_148._8_4_ = auVar16._8_4_;
  local_148._12_4_ = auVar16._12_4_;
  uStack_134 = auVar19._4_4_;
  local_138 = auVar19._0_4_ << shift;
  uStack_130 = auVar19._8_4_;
  uStack_12c = auVar19._12_4_;
  if (flipud == 0) {
    local_328 = *pauVar8;
    local_318 = *(undefined1 (*) [16])(*pauVar8 + lVar7 * 2);
    local_308 = *(undefined1 (*) [16])(*pauVar8 + (long)(stride * 2) * 2);
    local_2f8 = *(undefined1 (*) [16])(*pauVar8 + (long)(stride * 3) * 2);
    local_2e8 = *(undefined1 (*) [16])(*pauVar8 + (long)(stride * 4) * 2);
    local_2d8 = *(undefined1 (*) [16])(*pauVar8 + (long)(stride * 5) * 2);
    local_2c8 = *(undefined1 (*) [16])(*pauVar8 + (long)(stride * 6) * 2);
    pauVar8 = (undefined1 (*) [16])(*pauVar8 + (long)(stride * 7) * 2);
  }
  else {
    local_328 = *(undefined1 (*) [16])(*pauVar8 + (long)(stride * 7) * 2);
    local_318 = *(undefined1 (*) [16])(*pauVar8 + (long)(stride * 6) * 2);
    local_308 = *(undefined1 (*) [16])(*pauVar8 + (long)(stride * 5) * 2);
    local_2f8 = *(undefined1 (*) [16])(*pauVar8 + (long)(stride * 4) * 2);
    local_2e8 = *(undefined1 (*) [16])(*pauVar8 + (long)(stride * 3) * 2);
    local_2d8 = *(undefined1 (*) [16])(*pauVar8 + (long)(stride * 2) * 2);
    local_2c8 = *(undefined1 (*) [16])(*pauVar8 + lVar7 * 2);
  }
  local_2b8 = *pauVar8;
  if (fliplr != 0) {
    local_328 = pshufb(local_328,_DAT_005634a0);
    local_318 = pshufb(local_318,_DAT_005634a0);
    local_148 = pshufb(local_308,_DAT_005634a0);
    local_2f8 = pshufb(local_2f8,_DAT_005634a0);
    local_2e8 = pshufb(local_2e8,_DAT_005634a0);
    local_2d8 = pshufb(local_2d8,_DAT_005634a0);
    local_2c8 = pshufb(local_2c8,_DAT_005634a0);
    local_168 = pshufb(*pauVar8,_DAT_005634a0);
    local_308 = local_148;
    local_2b8 = local_168;
  }
  auVar20 = pmovsxwd(local_1a8,local_2e8);
  auVar29._8_4_ = local_2e8._8_4_;
  auVar29._12_4_ = local_2e8._12_4_;
  auVar29._0_8_ = local_2e8._8_8_;
  auVar23 = pmovsxwd(local_198,auVar29);
  auVar24 = pmovsxwd(local_188,local_2d8);
  auVar11._8_4_ = local_2d8._8_4_;
  auVar11._12_4_ = local_2d8._12_4_;
  auVar11._0_8_ = local_2d8._8_8_;
  auVar9 = pmovsxwd(auVar11,auVar11);
  auVar14 = pmovsxwd(local_168,local_2c8);
  auVar17._8_4_ = local_2c8._8_4_;
  auVar17._12_4_ = local_2c8._12_4_;
  auVar17._0_8_ = local_2c8._8_8_;
  auVar15 = pmovsxwd(auVar17,auVar17);
  auVar16 = pmovsxwd(local_148,local_2b8);
  auVar21._8_4_ = local_2b8._8_4_;
  auVar21._12_4_ = local_2b8._12_4_;
  auVar21._0_8_ = local_2b8._8_8_;
  auVar19 = pmovsxwd(auVar21,auVar21);
  auVar26 = pmovsxwd(local_1c8,local_2f8);
  auVar27._8_4_ = local_2f8._8_4_;
  auVar27._12_4_ = local_2f8._12_4_;
  auVar27._0_8_ = local_2f8._8_8_;
  auVar25 = pmovsxwd(auVar27,auVar27);
  auVar33 = pmovsxwd(local_1e8,local_308);
  auVar34._8_4_ = local_308._8_4_;
  auVar34._12_4_ = local_308._12_4_;
  auVar34._0_8_ = local_308._8_8_;
  auVar30 = pmovsxwd(auVar34,auVar34);
  auVar36 = pmovsxwd(local_208,local_318);
  auVar31._8_4_ = local_318._8_4_;
  auVar31._12_4_ = local_318._12_4_;
  auVar31._0_8_ = local_318._8_8_;
  auVar29 = pmovsxwd(auVar31,auVar31);
  auVar10 = pmovsxwd(auVar9,local_328);
  auVar39._8_4_ = local_328._8_4_;
  auVar39._12_4_ = local_328._12_4_;
  auVar39._0_8_ = local_328._8_8_;
  auVar37 = pmovsxwd(auVar39,auVar39);
  local_328._4_4_ = auVar10._4_4_;
  local_328._0_4_ = auVar10._0_4_ << shift;
  local_328._8_4_ = auVar10._8_4_;
  local_328._12_4_ = auVar10._12_4_;
  local_318._4_4_ = auVar37._4_4_;
  local_318._0_4_ = auVar37._0_4_ << shift;
  local_318._8_4_ = auVar37._8_4_;
  local_318._12_4_ = auVar37._12_4_;
  local_308._0_4_ = auVar36._0_4_ << shift;
  local_308._4_4_ = auVar36._4_4_;
  local_308._8_4_ = auVar36._8_4_;
  local_308._12_4_ = auVar36._12_4_;
  local_2e8._0_4_ = auVar33._0_4_ << shift;
  local_2e8._4_4_ = auVar33._4_4_;
  local_2e8._8_4_ = auVar33._8_4_;
  local_2e8._12_4_ = auVar33._12_4_;
  local_2f8._4_4_ = auVar29._4_4_;
  local_2f8._0_4_ = auVar29._0_4_ << shift;
  local_2f8._8_4_ = auVar29._8_4_;
  local_2f8._12_4_ = auVar29._12_4_;
  local_2d8._4_4_ = auVar30._4_4_;
  local_2d8._0_4_ = auVar30._0_4_ << shift;
  local_2d8._8_4_ = auVar30._8_4_;
  local_2d8._12_4_ = auVar30._12_4_;
  local_2c8._0_4_ = auVar26._0_4_ << shift;
  local_2c8._4_4_ = auVar26._4_4_;
  local_2c8._8_4_ = auVar26._8_4_;
  local_2c8._12_4_ = auVar26._12_4_;
  local_2a8._0_4_ = auVar20._0_4_ << shift;
  local_2a8._4_4_ = auVar20._4_4_;
  local_2a8._8_4_ = auVar20._8_4_;
  local_2a8._12_4_ = auVar20._12_4_;
  local_2b8._4_4_ = auVar25._4_4_;
  local_2b8._0_4_ = auVar25._0_4_ << shift;
  local_2b8._8_4_ = auVar25._8_4_;
  local_2b8._12_4_ = auVar25._12_4_;
  local_298._0_4_ = auVar23._0_4_ << shift;
  local_298._4_4_ = auVar23._4_4_;
  local_298._8_4_ = auVar23._8_4_;
  local_298._12_4_ = auVar23._12_4_;
  local_288._0_4_ = auVar24._0_4_ << shift;
  local_288._4_4_ = auVar24._4_4_;
  local_288._8_4_ = auVar24._8_4_;
  local_288._12_4_ = auVar24._12_4_;
  local_438 = auVar9._0_4_;
  uStack_434 = auVar9._4_4_;
  uStack_430 = auVar9._8_4_;
  uStack_42c = auVar9._12_4_;
  local_268._0_4_ = auVar14._0_4_ << shift;
  local_268._4_4_ = auVar14._4_4_;
  local_268._8_4_ = auVar14._8_4_;
  local_268._12_4_ = auVar14._12_4_;
  uStack_274 = uStack_434;
  local_278 = local_438 << shift;
  uStack_270 = uStack_430;
  uStack_26c = uStack_42c;
  uStack_254 = auVar15._4_4_;
  local_258 = auVar15._0_4_ << shift;
  uStack_250 = auVar15._8_4_;
  uStack_24c = auVar15._12_4_;
  local_248._0_4_ = auVar16._0_4_ << shift;
  local_248._4_4_ = auVar16._4_4_;
  local_248._8_4_ = auVar16._8_4_;
  local_248._12_4_ = auVar16._12_4_;
  uStack_234 = auVar19._4_4_;
  local_238 = auVar19._0_4_ << shift;
  uStack_230 = auVar19._8_4_;
  uStack_22c = auVar19._12_4_;
  if (flipud == 0) {
    local_128 = *pauVar6;
    local_118 = *(undefined1 (*) [16])(*pauVar6 + lVar7 * 2);
    local_108 = *(undefined1 (*) [16])(*pauVar6 + (long)(stride * 2) * 2);
    local_f8 = *(undefined1 (*) [16])(*pauVar6 + (long)(stride * 3) * 2);
    local_e8 = *(undefined1 (*) [16])(*pauVar6 + (long)(stride * 4) * 2);
    local_d8 = *(undefined1 (*) [16])(*pauVar6 + (long)(stride * 5) * 2);
    local_c8 = *(undefined1 (*) [16])(*pauVar6 + (long)(stride * 6) * 2);
    pauVar6 = (undefined1 (*) [16])(*pauVar6 + (long)(stride * 7) * 2);
  }
  else {
    local_128 = *(undefined1 (*) [16])(*pauVar6 + (long)(stride * 7) * 2);
    local_118 = *(undefined1 (*) [16])(*pauVar6 + (long)(stride * 6) * 2);
    local_108 = *(undefined1 (*) [16])(*pauVar6 + (long)(stride * 5) * 2);
    local_f8 = *(undefined1 (*) [16])(*pauVar6 + (long)(stride << 2) * 2);
    local_e8 = *(undefined1 (*) [16])(*pauVar6 + (long)(stride * 3) * 2);
    local_d8 = *(undefined1 (*) [16])(*pauVar6 + (long)(stride * 2) * 2);
    local_c8 = *(undefined1 (*) [16])(*pauVar6 + lVar7 * 2);
  }
  local_b8 = *pauVar6;
  if (fliplr != 0) {
    local_128 = pshufb(local_128,_DAT_005634a0);
    local_118 = pshufb(local_118,_DAT_005634a0);
    local_248 = pshufb(local_108,_DAT_005634a0);
    local_f8 = pshufb(local_f8,_DAT_005634a0);
    local_e8 = pshufb(local_e8,_DAT_005634a0);
    local_d8 = pshufb(local_d8,_DAT_005634a0);
    local_c8 = pshufb(local_c8,_DAT_005634a0);
    local_268 = pshufb(*pauVar6,_DAT_005634a0);
    local_108 = local_248;
    local_b8 = local_268;
  }
  auVar20 = pmovsxwd(local_2a8,local_e8);
  auVar12._8_4_ = local_e8._8_4_;
  auVar12._12_4_ = local_e8._12_4_;
  auVar12._0_8_ = local_e8._8_8_;
  auVar23 = pmovsxwd(local_298,auVar12);
  auVar24 = pmovsxwd(local_288,local_d8);
  auVar13._8_4_ = local_d8._8_4_;
  auVar13._12_4_ = local_d8._12_4_;
  auVar13._0_8_ = local_d8._8_8_;
  auVar9 = pmovsxwd(auVar13,auVar13);
  auVar14 = pmovsxwd(local_268,local_c8);
  auVar18._8_4_ = local_c8._8_4_;
  auVar18._12_4_ = local_c8._12_4_;
  auVar18._0_8_ = local_c8._8_8_;
  auVar15 = pmovsxwd(auVar18,auVar18);
  auVar16 = pmovsxwd(local_248,local_b8);
  auVar22._8_4_ = local_b8._8_4_;
  auVar22._12_4_ = local_b8._12_4_;
  auVar22._0_8_ = local_b8._8_8_;
  auVar19 = pmovsxwd(auVar22,auVar22);
  auVar26 = pmovsxwd(local_2c8,local_f8);
  auVar28._8_4_ = local_f8._8_4_;
  auVar28._12_4_ = local_f8._12_4_;
  auVar28._0_8_ = local_f8._8_8_;
  auVar25 = pmovsxwd(auVar28,auVar28);
  auVar33 = pmovsxwd(local_2e8,local_108);
  auVar35._8_4_ = local_108._8_4_;
  auVar35._12_4_ = local_108._12_4_;
  auVar35._0_8_ = local_108._8_8_;
  auVar30 = pmovsxwd(auVar35,auVar35);
  auVar36 = pmovsxwd(local_308,local_118);
  auVar32._8_4_ = local_118._8_4_;
  auVar32._12_4_ = local_118._12_4_;
  auVar32._0_8_ = local_118._8_8_;
  auVar29 = pmovsxwd(auVar32,auVar32);
  auVar10 = pmovsxwd(auVar9,local_128);
  auVar40._8_4_ = local_128._8_4_;
  auVar40._12_4_ = local_128._12_4_;
  auVar40._0_8_ = local_128._8_8_;
  auVar37 = pmovsxwd(auVar40,auVar40);
  local_128._4_4_ = auVar10._4_4_;
  local_128._0_4_ = auVar10._0_4_ << shift;
  local_128._8_4_ = auVar10._8_4_;
  local_128._12_4_ = auVar10._12_4_;
  local_118._4_4_ = auVar37._4_4_;
  local_118._0_4_ = auVar37._0_4_ << shift;
  local_118._8_4_ = auVar37._8_4_;
  local_118._12_4_ = auVar37._12_4_;
  local_108._4_4_ = auVar36._4_4_;
  local_108._0_4_ = auVar36._0_4_ << shift;
  local_108._8_4_ = auVar36._8_4_;
  local_108._12_4_ = auVar36._12_4_;
  local_f8._4_4_ = auVar29._4_4_;
  local_f8._0_4_ = auVar29._0_4_ << shift;
  local_f8._8_4_ = auVar29._8_4_;
  local_f8._12_4_ = auVar29._12_4_;
  local_e8._4_4_ = auVar33._4_4_;
  local_e8._0_4_ = auVar33._0_4_ << shift;
  local_e8._8_4_ = auVar33._8_4_;
  local_e8._12_4_ = auVar33._12_4_;
  local_d8._4_4_ = auVar30._4_4_;
  local_d8._0_4_ = auVar30._0_4_ << shift;
  local_d8._8_4_ = auVar30._8_4_;
  local_d8._12_4_ = auVar30._12_4_;
  local_c8._4_4_ = auVar26._4_4_;
  local_c8._0_4_ = auVar26._0_4_ << shift;
  local_c8._8_4_ = auVar26._8_4_;
  local_c8._12_4_ = auVar26._12_4_;
  local_b8._4_4_ = auVar25._4_4_;
  local_b8._0_4_ = auVar25._0_4_ << shift;
  local_b8._8_4_ = auVar25._8_4_;
  local_b8._12_4_ = auVar25._12_4_;
  uStack_a4 = auVar20._4_4_;
  local_a8 = auVar20._0_4_ << shift;
  uStack_a0 = auVar20._8_4_;
  uStack_9c = auVar20._12_4_;
  uStack_94 = auVar23._4_4_;
  local_98 = auVar23._0_4_ << shift;
  uStack_90 = auVar23._8_4_;
  uStack_8c = auVar23._12_4_;
  uStack_84 = auVar24._4_4_;
  local_88 = auVar24._0_4_ << shift;
  uStack_80 = auVar24._8_4_;
  uStack_7c = auVar24._12_4_;
  local_438 = auVar9._0_4_;
  uStack_434 = auVar9._4_4_;
  uStack_430 = auVar9._8_4_;
  uStack_42c = auVar9._12_4_;
  uStack_74 = uStack_434;
  local_78 = local_438 << shift;
  uStack_70 = uStack_430;
  uStack_6c = uStack_42c;
  uStack_64 = auVar14._4_4_;
  local_68 = auVar14._0_4_ << shift;
  uStack_60 = auVar14._8_4_;
  uStack_5c = auVar14._12_4_;
  uStack_54 = auVar15._4_4_;
  local_58 = auVar15._0_4_ << shift;
  uStack_50 = auVar15._8_4_;
  uStack_4c = auVar15._12_4_;
  uStack_44 = auVar16._4_4_;
  local_48 = auVar16._0_4_ << shift;
  uStack_40 = auVar16._8_4_;
  uStack_3c = auVar16._12_4_;
  uStack_34 = auVar19._4_4_;
  local_38 = auVar19._0_4_ << shift;
  uStack_30 = auVar19._8_4_;
  uStack_2c = auVar19._12_4_;
  lVar7 = 0;
  do {
    uVar2 = *(undefined8 *)(local_428 + lVar7 + 8);
    puVar1 = (undefined8 *)((long)*out + lVar7 * 2);
    *puVar1 = *(undefined8 *)(local_428 + lVar7);
    puVar1[1] = uVar2;
    uVar2 = *(undefined8 *)(local_418 + lVar7 + 8);
    puVar1 = (undefined8 *)((long)out[1] + lVar7 * 2);
    *puVar1 = *(undefined8 *)(local_418 + lVar7);
    puVar1[1] = uVar2;
    uVar2 = *(undefined8 *)(local_328 + lVar7 + 8);
    puVar1 = (undefined8 *)((long)out[2] + lVar7 * 2);
    *puVar1 = *(undefined8 *)(local_328 + lVar7);
    puVar1[1] = uVar2;
    uVar2 = *(undefined8 *)(local_318 + lVar7 + 8);
    puVar1 = (undefined8 *)((long)out[3] + lVar7 * 2);
    *puVar1 = *(undefined8 *)(local_318 + lVar7);
    puVar1[1] = uVar2;
    lVar7 = lVar7 + 0x20;
  } while ((int)lVar7 != 0x100);
  lVar7 = 0;
  do {
    uVar2 = *(undefined8 *)(local_228 + lVar7 + 8);
    puVar1 = (undefined8 *)((long)out[0x20] + lVar7 * 2);
    *puVar1 = *(undefined8 *)(local_228 + lVar7);
    puVar1[1] = uVar2;
    uVar2 = *(undefined8 *)(local_218 + lVar7 + 8);
    puVar1 = (undefined8 *)((long)out[0x21] + lVar7 * 2);
    *puVar1 = *(undefined8 *)(local_218 + lVar7);
    puVar1[1] = uVar2;
    uVar2 = *(undefined8 *)(local_128 + lVar7 + 8);
    puVar1 = (undefined8 *)((long)out[0x22] + lVar7 * 2);
    *puVar1 = *(undefined8 *)(local_128 + lVar7);
    puVar1[1] = uVar2;
    uVar2 = *(undefined8 *)(local_118 + lVar7 + 8);
    puVar1 = (undefined8 *)((long)out[0x23] + lVar7 * 2);
    *puVar1 = *(undefined8 *)(local_118 + lVar7);
    puVar1[1] = uVar2;
    lVar7 = lVar7 + 0x20;
  } while ((int)lVar7 != 0x100);
  return;
}

Assistant:

static inline void load_buffer_16x16(const int16_t *input, __m128i *out,
                                     int stride, int flipud, int fliplr,
                                     int shift) {
  __m128i in[64];
  // Load 4 8x8 blocks
  const int16_t *topL = input;
  const int16_t *topR = input + 8;
  const int16_t *botL = input + 8 * stride;
  const int16_t *botR = input + 8 * stride + 8;

  const int16_t *tmp;

  if (flipud) {
    // Swap left columns
    tmp = topL;
    topL = botL;
    botL = tmp;
    // Swap right columns
    tmp = topR;
    topR = botR;
    botR = tmp;
  }

  if (fliplr) {
    // Swap top rows
    tmp = topL;
    topL = topR;
    topR = tmp;
    // Swap bottom rows
    tmp = botL;
    botL = botR;
    botR = tmp;
  }

  // load first 8 columns
  load_buffer_8x8(topL, &in[0], stride, flipud, fliplr, shift);
  load_buffer_8x8(botL, &in[32], stride, flipud, fliplr, shift);

  // load second 8 columns
  load_buffer_8x8(topR, &in[16], stride, flipud, fliplr, shift);
  load_buffer_8x8(botR, &in[48], stride, flipud, fliplr, shift);

  convert_8x8_to_16x16(in, out);
}